

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_a9701::SerialQueueImpl::~SerialQueueImpl(SerialQueueImpl *this)

{
  function<void_()> local_30;
  SerialQueueImpl *local_10;
  SerialQueueImpl *this_local;
  
  local_10 = this;
  std::function<void_()>::function(&local_30);
  addOperation(this,&local_30);
  std::function<void_()>::~function(&local_30);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
            (&this->operationsThread);
  std::thread::join();
  std::condition_variable::~condition_variable(&this->readyOperationsCondition);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&this->operations);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (&this->operationsThread);
  return;
}

Assistant:

~SerialQueueImpl() {
    // Signal the worker to shut down.
    addOperation({});

    // Wait for the worker to complete.
    operationsThread->join();
  }